

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.h
# Opt level: O0

bool __thiscall
flatbuffers::VerifierTemplate<false>::VerifyVectorOfTables<reflection::Enum>
          (VerifierTemplate<false> *this,
          Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int> *vec)

{
  bool bVar1;
  uint uVar2;
  return_type this_00;
  uint local_24;
  uoffset_t i;
  Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int> *vec_local;
  VerifierTemplate<false> *this_local;
  
  if (vec != (Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int> *)0x0) {
    for (local_24 = 0;
        uVar2 = Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int>::size(vec),
        local_24 < uVar2; local_24 = local_24 + 1) {
      this_00 = Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int>::Get(vec,local_24);
      bVar1 = reflection::Enum::Verify(this_00,this);
      if (!bVar1) {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool VerifyVectorOfTables(const Vector<Offset<T>> *const vec) {
    if (vec) {
      for (uoffset_t i = 0; i < vec->size(); i++) {
        if (!vec->Get(i)->Verify(*this)) return false;
      }
    }
    return true;
  }